

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O1

void png_set_add_alpha(png_structrp png_ptr,png_uint_32 filler,int filler_loc)

{
  if (png_ptr != (png_structrp)0x0) {
    png_set_filler(png_ptr,filler,filler_loc);
    if ((short)png_ptr->transformations < 0) {
      png_ptr->transformations = png_ptr->transformations | 0x1000000;
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_add_alpha(png_structrp png_ptr, png_uint_32 filler, int filler_loc)
{
   png_debug(1, "in png_set_add_alpha");

   if (png_ptr == NULL)
      return;

   png_set_filler(png_ptr, filler, filler_loc);
   /* The above may fail to do anything. */
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_ptr->transformations |= PNG_ADD_ALPHA;
}